

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_descend(archive *_a)

{
  tree *t_00;
  int iVar1;
  wchar_t wVar2;
  wchar_t magic_test;
  tree *t;
  archive_read_disk *a;
  archive *_a_local;
  
  t_00 = (tree *)_a[1].vtable;
  iVar1 = __archive_check_magic(_a,0xbadb0c5,6,"archive_read_disk_descend");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else if ((t_00->visit_type == 1) && (t_00->descend != 0)) {
    wVar2 = tree_current_is_physical_dir(t_00);
    if (wVar2 == L'\0') {
      wVar2 = tree_current_is_dir(t_00);
      if (wVar2 != L'\0') {
        tree_push(t_00,t_00->basename,t_00->current_filesystem_id,(t_00->st).st_dev,
                  (t_00->st).st_ino,&t_00->restore_time);
        t_00->stack->flags = t_00->stack->flags | 2;
      }
    }
    else {
      tree_push(t_00,t_00->basename,t_00->current_filesystem_id,(t_00->lst).st_dev,
                (t_00->lst).st_ino,&t_00->restore_time);
      t_00->stack->flags = t_00->stack->flags | 1;
    }
    t_00->descend = 0;
    _a_local._4_4_ = L'\0';
  }
  else {
    _a_local._4_4_ = L'\0';
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_descend(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct tree *t = a->tree;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
	    "archive_read_disk_descend");

	if (t->visit_type != TREE_REGULAR || !t->descend)
		return (ARCHIVE_OK);

	if (tree_current_is_physical_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->lst.st_dev, t->lst.st_ino, &t->restore_time);
		t->stack->flags |= isDir;
	} else if (tree_current_is_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->st.st_dev, t->st.st_ino, &t->restore_time);
		t->stack->flags |= isDirLink;
	}
	t->descend = 0;
	return (ARCHIVE_OK);
}